

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * __thiscall
httplib::detail::from_i_to_hex_abi_cxx11_(string *__return_storage_ptr__,detail *this,size_t n)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_21;
  char *local_20;
  char *charset;
  size_t n_local;
  string *ret;
  
  local_20 = "0123456789abcdef";
  local_21 = 0;
  charset = (char *)this;
  n_local = (size_t)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  do {
    std::operator+(&local_48,local_20[(uint)charset & 0xf],__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    charset = (char *)((ulong)charset >> 4);
  } while (charset != (char *)0x0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string from_i_to_hex(size_t n) {
  const char *charset = "0123456789abcdef";
  std::string ret;
  do {
    ret = charset[n & 15] + ret;
    n >>= 4;
  } while (n > 0);
  return ret;
}